

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Entry * __thiscall
kj::Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>::
add<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>
          (Vector<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry> *this,Entry *params)

{
  bool bVar1;
  Entry *pEVar2;
  Entry *params_local;
  Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *this_local;
  
  bVar1 = ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::isFull
                    ((ArrayBuilder<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)
                     this);
  if (bVar1) {
    Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::grow
              ((Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)this,0);
  }
  pEVar2 = fwd<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>(params);
  pEVar2 = ArrayBuilder<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>::
           add<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry>
                     ((ArrayBuilder<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry> *)
                      this,pEVar2);
  return pEVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }